

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample_predict_threaded.cc
# Opt level: O2

int main(int argc,char **argv)

{
  Worker threadfunc;
  int iVar1;
  vw *this_vw;
  ezexample *peVar2;
  ostream *poVar3;
  int iVar4;
  float fVar5;
  double local_2b8;
  vw *local_2b0;
  vector<double,_std::allocator<double>_> results;
  undefined8 uStack_280;
  string vw_init_string_parser;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string vw_init_string_all;
  ezexample ex;
  
  if (argc == 3) {
    iVar1 = atoi(argv[1]);
    runcount = atoi(argv[2]);
    std::__cxx11::string::string
              ((string *)&vw_init_string_all,
               "-t --ldf_override s --quiet -q st --noconstant --hash all -i train.w",
               (allocator *)&ex);
    std::__cxx11::string::string
              ((string *)&vw_init_string_parser,
               "-t --ldf_override s --quiet -q st --noconstant --hash all --noop",(allocator *)&ex);
    std::__cxx11::string::string((string *)&local_1e8,(string *)&vw_init_string_all);
    this_vw = VW::initialize(&local_1e8,(io_buf *)0x0,false,(trace_message_t)0x0,(void *)0x0);
    std::__cxx11::string::~string((string *)&local_1e8);
    results.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    results.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    results.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_2b0 = this_vw;
    ezexample::ezexample(&ex,this_vw,false,(vw *)0x0);
    ezexample::addns(&ex,'s');
    peVar2 = ezexample::operator()(&ex,"p^the_man");
    peVar2 = ezexample::operator()(peVar2,"w^the");
    peVar2 = ezexample::operator()(peVar2,"w^man");
    ezexample::addns(peVar2,'t');
    peVar2 = ezexample::operator()(peVar2,"p^le_homme");
    peVar2 = ezexample::operator()(peVar2,"w^le");
    ezexample::operator()(peVar2,"w^homme");
    std::__cxx11::string::string((string *)&local_208,"1",(allocator *)&local_2b8);
    ezexample::set_label(&ex,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    fVar5 = ezexample::predict_partial(&ex);
    local_2b8 = (double)fVar5;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(&results,&local_2b8);
    poVar3 = std::operator<<((ostream *)&std::cerr,"should be near zero = ");
    fVar5 = ezexample::predict_partial(&ex);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar5);
    std::endl<char,std::char_traits<char>>(poVar3);
    ezexample::remns(&ex);
    ezexample::addns(&ex,'t');
    peVar2 = ezexample::operator()(&ex,"p^un_homme");
    peVar2 = ezexample::operator()(peVar2,"w^un");
    ezexample::operator()(peVar2,"w^homme");
    std::__cxx11::string::string((string *)&local_228,"1",(allocator *)&local_2b8);
    ezexample::set_label(&ex,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    fVar5 = ezexample::predict_partial(&ex);
    local_2b8 = (double)fVar5;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(&results,&local_2b8);
    poVar3 = std::operator<<((ostream *)&std::cerr,"should be near one  = ");
    fVar5 = ezexample::predict_partial(&ex);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar5);
    std::endl<char,std::char_traits<char>>(poVar3);
    ezexample::remns(&ex);
    peVar2 = ezexample::operator()(&ex,'t',"p^un_homme");
    peVar2 = ezexample::operator()(peVar2,'t',"w^un");
    ezexample::operator()(peVar2,'t',"w^homme");
    std::__cxx11::string::string((string *)&local_248,"1",(allocator *)&local_2b8);
    ezexample::set_label(&ex,&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    fVar5 = ezexample::predict_partial(&ex);
    local_2b8 = (double)fVar5;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(&results,&local_2b8);
    poVar3 = std::operator<<((ostream *)&std::cerr,"should be near one  = ");
    fVar5 = ezexample::predict_partial(&ex);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar5);
    std::endl<char,std::char_traits<char>>(poVar3);
    ezexample::~ezexample(&ex);
    if (iVar1 == 0) {
      ex.vw_ref = local_2b0;
      ex.ec = (example *)&vw_init_string_parser;
      ex._16_8_ = &results;
      Worker::operator()((Worker *)&ex);
    }
    else {
      boost::thread_group::thread_group((thread_group *)&ex);
      iVar4 = 0;
      if (iVar1 < 1) {
        iVar1 = 0;
      }
      for (; iVar1 != iVar4; iVar4 = iVar4 + 1) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"starting thread ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        threadfunc.m_vw_parser = (vw *)uStack_280;
        threadfunc.m_vw = local_2b0;
        threadfunc.m_referenceValues = &results;
        threadfunc.vw_init_string = &vw_init_string_parser;
        boost::thread_group::create_thread<Worker>((thread_group *)&ex,threadfunc);
      }
      boost::thread_group::join_all((thread_group *)&ex);
      poVar3 = std::operator<<((ostream *)&std::cerr,"finished!");
      std::endl<char,std::char_traits<char>>(poVar3);
      boost::thread_group::~thread_group((thread_group *)&ex);
    }
    VW::finish(local_2b0,true);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&results.super__Vector_base<double,_std::allocator<double>_>);
    std::__cxx11::string::~string((string *)&vw_init_string_parser);
    std::__cxx11::string::~string((string *)&vw_init_string_all);
    iVar1 = 0;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"need two args: threadcount runcount");
    std::endl<char,std::char_traits<char>>(poVar3);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int main(int argc, char *argv[])
{ if (argc != 3)
  { cerr << "need two args: threadcount runcount" << endl;
    return 1;
  }
  int threadcount = atoi(argv[1]);
  runcount = atoi(argv[2]);
  // INITIALIZE WITH WHATEVER YOU WOULD PUT ON THE VW COMMAND LINE -- THIS READS IN A MODEL FROM train.w
  string vw_init_string_all    = "-t --ldf_override s --quiet -q st --noconstant --hash all -i train.w";
  string vw_init_string_parser = "-t --ldf_override s --quiet -q st --noconstant --hash all --noop";   // this needs to have enough arguments to get the parser right
  vw*vw = VW::initialize(vw_init_string_all);
  vector<double> results;

  // HAL'S SPIFFY INTERFACE USING C++ CRAZINESS
  { ezexample ex(vw, false);
    ex(vw_namespace('s'))
    ("p^the_man")
    ("w^the")
    ("w^man")
    (vw_namespace('t'))
    ("p^le_homme")
    ("w^le")
    ("w^homme");
    ex.set_label("1");
    results.push_back(ex.predict_partial());
    cerr << "should be near zero = " << ex.predict_partial() << endl;

    --ex;   // remove the most recent namespace
    ex(vw_namespace('t'))
    ("p^un_homme")
    ("w^un")
    ("w^homme");
    ex.set_label("1");
    results.push_back(ex.predict_partial());
    cerr << "should be near one  = " << ex.predict_partial() << endl;

    --ex;   // remove the most recent namespace
    // add features with explicit ns
    ex('t', "p^un_homme")
    ('t', "w^un")
    ('t', "w^homme");
    ex.set_label("1");
    results.push_back(ex.predict_partial());
    cerr << "should be near one  = " << ex.predict_partial() << endl;
  }

  if (threadcount == 0)
  { Worker w(*vw, vw_init_string_parser, results);
    w();
  }
  else
  { boost::thread_group tg;
    for (int t = 0; t < threadcount; ++t)
    { cerr << "starting thread " << t << endl;
      boost::thread * pt = tg.create_thread(Worker(*vw, vw_init_string_parser, results));
    }
    tg.join_all();
    cerr << "finished!" << endl;
  }


  // AND FINISH UP
  VW::finish(*vw);
}